

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.cc
# Opt level: O0

uint64_t __thiscall bloaty::dwarf::AttrValue::GetUint(AttrValue *this,CU *cu)

{
  AttrValue *in_RDI;
  CU *in_stack_ffffffffffffffd8;
  uint64_t local_8;
  
  if (in_RDI->type_ == kUnresolvedUint) {
    local_8 = ResolveIndirectAddress(in_RDI,in_stack_ffffffffffffffd8);
  }
  else {
    if (in_RDI->type_ != kUint) {
      __assert_fail("type_ == Type::kUint",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/dwarf/attr.cc"
                    ,0x36,"uint64_t bloaty::dwarf::AttrValue::GetUint(const CU &) const");
    }
    if (in_RDI->form_ == 0x21) {
      __assert_fail("form_ != DW_FORM_implicit_const",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/dwarf/attr.cc"
                    ,0x3a,"uint64_t bloaty::dwarf::AttrValue::GetUint(const CU &) const");
    }
    local_8 = (in_RDI->field_0).uint_;
  }
  return local_8;
}

Assistant:

uint64_t AttrValue::GetUint(const CU& cu) const {
  if (type_ == Type::kUnresolvedUint) {
    return ResolveIndirectAddress(cu);
  } else {
    assert(type_ == Type::kUint);
    // DW_FORM_implicit_const value is stored in AbbrevTable, but
    // we don't keep it in AttrValue (discarded in AbbrevTable::ReadAbbrevs()).
    // Assertion makes sure that nobody is trying to read a fake value.
    assert(form_ != DW_FORM_implicit_const);
    return uint_;
  }
}